

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O0

void math::internal::matrix_gk_svd_step<double>
               (int rows,int cols,double *mat_b,double *mat_q,double *mat_p,int p,int q,
               double *epsilon)

{
  int rows_a;
  reference mat_a;
  double *mat_res;
  int iVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double local_128;
  double local_110;
  double givens_s;
  double givens_c;
  double dStack_f8;
  int k_1;
  double beta;
  double alpha;
  double dStack_e0;
  int k;
  double mu;
  double diff2;
  double diff1;
  double eig_2;
  double eig_1;
  double mat_c [4];
  int local_90;
  int local_8c;
  int j_1;
  int i_1;
  int j;
  int i;
  double *mat_tmp;
  double *mat_b22_t;
  double *mat_b22;
  allocator<double> local_51;
  undefined1 local_50 [8];
  vector<double,_std::allocator<double>_> buffer;
  int mat_sizes;
  int slice_length;
  int p_local;
  double *mat_p_local;
  double *mat_q_local;
  double *mat_b_local;
  int cols_local;
  int rows_local;
  double *pdVar2;
  
  rows_a = (cols - q) - p;
  buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = rows_a * rows_a;
  iVar1 = buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._4_4_ * 3;
  std::allocator<double>::allocator(&local_51);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_50,(long)iVar1,&local_51);
  std::allocator<double>::~allocator(&local_51);
  mat_a = std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)local_50,0);
  pdVar2 = mat_a + buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
  mat_res = pdVar2 + buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
  for (i_1 = 0; i_1 < rows_a; i_1 = i_1 + 1) {
    for (j_1 = 0; j_1 < rows_a; j_1 = j_1 + 1) {
      mat_a[i_1 * rows_a + j_1] = mat_b[(p + i_1) * cols + p + j_1];
    }
  }
  for (local_8c = 0; local_8c < rows_a; local_8c = local_8c + 1) {
    for (local_90 = 0; local_90 < rows_a; local_90 = local_90 + 1) {
      pdVar2[local_8c * rows_a + local_90] = mat_a[local_90 * rows_a + local_8c];
    }
  }
  matrix_multiply<double>(mat_a,rows_a,rows_a,pdVar2,rows_a,mat_res);
  eig_1 = mat_res[(rows_a + -2) * rows_a + -2 + rows_a];
  mat_c[0] = mat_res[rows_a + -1 + (rows_a + -2) * rows_a];
  mat_c[1] = mat_res[rows_a + -2 + (rows_a + -1) * rows_a];
  mat_c[2] = mat_res[(rows_a + -1) * rows_a + -1 + rows_a];
  pdVar2 = &eig_1;
  matrix_2x2_eigenvalues<double>(pdVar2,&eig_2,&diff1);
  iVar1 = (int)pdVar2;
  std::abs(iVar1);
  diff2 = extraout_XMM0_Qa;
  std::abs(iVar1);
  if (extraout_XMM0_Qa_00 <= diff2) {
    local_128 = diff1;
  }
  else {
    local_128 = eig_2;
  }
  dStack_e0 = local_128;
  beta = mat_b[p * cols + p] * mat_b[p * cols + p] + -local_128;
  dStack_f8 = mat_b[p * cols + p] * mat_b[p * cols + p + 1];
  alpha._4_4_ = p;
  for (givens_c._4_4_ = p; givens_c._4_4_ < (cols - q) + -1; givens_c._4_4_ = givens_c._4_4_ + 1) {
    matrix_givens_rotation<double>(&beta,&stack0xffffffffffffff08,&givens_s,&local_110,epsilon);
    matrix_apply_givens_column<double>
              (mat_b,cols,cols,givens_c._4_4_,givens_c._4_4_ + 1,&givens_s,&local_110);
    matrix_apply_givens_column<double>
              (mat_p,cols,cols,givens_c._4_4_,givens_c._4_4_ + 1,&givens_s,&local_110);
    beta = mat_b[givens_c._4_4_ * cols + givens_c._4_4_];
    dStack_f8 = mat_b[(givens_c._4_4_ + 1) * cols + givens_c._4_4_];
    matrix_givens_rotation<double>(&beta,&stack0xffffffffffffff08,&givens_s,&local_110,epsilon);
    matrix_apply_givens_row<double>
              (mat_b,cols,cols,givens_c._4_4_,givens_c._4_4_ + 1,&givens_s,&local_110);
    matrix_apply_givens_column<double>
              (mat_q,rows,cols,givens_c._4_4_,givens_c._4_4_ + 1,&givens_s,&local_110);
    if (givens_c._4_4_ < (cols - q) + -2) {
      beta = mat_b[givens_c._4_4_ * cols + givens_c._4_4_ + 1];
      dStack_f8 = mat_b[givens_c._4_4_ * cols + givens_c._4_4_ + 2];
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_50);
  return;
}

Assistant:

void
matrix_gk_svd_step (int rows, int cols, T* mat_b, T* mat_q, T* mat_p,
    int p, int q, T const& epsilon)
{
    int const slice_length = cols - q - p;
    int const mat_sizes = slice_length * slice_length;
    std::vector<T> buffer(3 * mat_sizes);
    T* mat_b22 = &buffer[0];
    T* mat_b22_t = mat_b22 + mat_sizes;
    T* mat_tmp = mat_b22_t + mat_sizes;

    for (int i = 0; i < slice_length; ++i)
        for (int j = 0; j < slice_length; ++j)
            mat_b22[i * slice_length + j] = mat_b[(p + i) *  cols + (p + j)];
    for (int i = 0; i < slice_length; ++i)
        for (int j = 0; j < slice_length; ++j)
            mat_b22_t[i * slice_length + j] = mat_b22[j * slice_length + i];

    /* Slice outer product gives covariance matrix. */
    matrix_multiply(mat_b22, slice_length, slice_length, mat_b22_t,
        slice_length, mat_tmp);

    T mat_c[2 * 2];
    mat_c[0] = mat_tmp[(slice_length - 2) * slice_length + (slice_length - 2)];
    mat_c[1] = mat_tmp[(slice_length - 2) * slice_length + (slice_length - 1)];
    mat_c[2] = mat_tmp[(slice_length - 1) * slice_length + (slice_length - 2)];
    mat_c[3] = mat_tmp[(slice_length - 1) * slice_length + (slice_length - 1)];

    /* Use eigenvalue that is closer to the lower right entry of the slice. */
    T eig_1, eig_2;
    matrix_2x2_eigenvalues(mat_c, &eig_1, &eig_2);

    T diff1 = std::abs(mat_c[3] - eig_1);
    T diff2 = std::abs(mat_c[3] - eig_2);
    T mu = (diff1 < diff2) ? eig_1 : eig_2;

    /* Zero another entry bz applyting givens rotations. */
    int k = p;
    T alpha = mat_b[k * cols + k] * mat_b[k * cols + k] - mu;
    T beta = mat_b[k * cols + k] * mat_b[k * cols + (k + 1)];

    for (int k = p; k < cols - q - 1; ++k)
    {
        T givens_c, givens_s;
        matrix_givens_rotation(alpha, beta, &givens_c, &givens_s, epsilon);
        matrix_apply_givens_column(mat_b, cols, cols, k, k + 1, givens_c,
            givens_s);
        matrix_apply_givens_column(mat_p, cols, cols, k, k + 1, givens_c,
            givens_s);

        alpha = mat_b[k * cols + k];
        beta = mat_b[(k + 1) * cols + k];
        matrix_givens_rotation(alpha, beta, &givens_c, &givens_s, epsilon);
        internal::matrix_apply_givens_row(mat_b, cols, cols, k, k + 1,
            givens_c, givens_s);
        internal::matrix_apply_givens_column(mat_q, rows, cols, k, k + 1,
            givens_c, givens_s);

        if (k < (cols - q - 2))
        {
            alpha = mat_b[k * cols + (k + 1)];
            beta = mat_b[k * cols + (k + 2)];
        }
    }
}